

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

CompressionResult __thiscall
duckdb::TemporaryFileManager::CompressBuffer
          (TemporaryFileManager *this,TemporaryFileCompressionAdaptivity *compression_adaptivity,
          FileBuffer *buffer,AllocatedData *compressed_buffer)

{
  TemporaryCompressionLevel compressionLevel;
  size_t sVar1;
  Allocator *this_00;
  ulong uVar2;
  CompressionResult CVar3;
  AllocatedData AStack_48;
  
  uVar2 = 0x40000;
  if (0x8000 < buffer->internal_size) {
    compressionLevel =
         TemporaryFileCompressionAdaptivity::GetCompressionLevel(compression_adaptivity);
    if (compressionLevel != UNCOMPRESSED) {
      sVar1 = duckdb_zstd::ZSTD_compressBound(buffer->internal_size);
      this_00 = Allocator::Get(this->db);
      Allocator::Allocate(&AStack_48,this_00,sVar1 + 8);
      AllocatedData::operator=(compressed_buffer,&AStack_48);
      AllocatedData::~AllocatedData(&AStack_48);
      sVar1 = duckdb_zstd::ZSTD_compress
                        (compressed_buffer->pointer + 8,sVar1,buffer->internal_buffer,
                         buffer->internal_size,compressionLevel);
      *(size_t *)compressed_buffer->pointer = sVar1;
      if (0xfffffffffffc7ffe < sVar1 - 0x37ff9) {
        uVar2 = sVar1 + 0x8007 & 0xffffffffffff8000;
      }
      goto LAB_01ad2b2e;
    }
  }
  compressionLevel = UNCOMPRESSED;
LAB_01ad2b2e:
  CVar3.level = compressionLevel;
  CVar3.size = uVar2;
  CVar3._12_4_ = 0;
  return CVar3;
}

Assistant:

TemporaryFileManager::CompressionResult
TemporaryFileManager::CompressBuffer(TemporaryFileCompressionAdaptivity &compression_adaptivity, FileBuffer &buffer,
                                     AllocatedData &compressed_buffer) {
	if (buffer.AllocSize() <= TemporaryBufferSizeToSize(MinimumCompressedTemporaryBufferSize())) {
		// Buffer size is less or equal to the minimum compressed size - no point compressing
		return {TemporaryBufferSize::DEFAULT, TemporaryCompressionLevel::UNCOMPRESSED};
	}

	const auto level = compression_adaptivity.GetCompressionLevel();
	if (level == TemporaryCompressionLevel::UNCOMPRESSED) {
		return {TemporaryBufferSize::DEFAULT, TemporaryCompressionLevel::UNCOMPRESSED};
	}

	const auto compression_level = static_cast<int>(level);
	D_ASSERT(compression_level >= duckdb_zstd::ZSTD_minCLevel() && compression_level <= duckdb_zstd::ZSTD_maxCLevel());
	const auto zstd_bound = duckdb_zstd::ZSTD_compressBound(buffer.AllocSize());
	compressed_buffer = Allocator::Get(db).Allocate(sizeof(idx_t) + zstd_bound);
	const auto zstd_size = duckdb_zstd::ZSTD_compress(compressed_buffer.get() + sizeof(idx_t), zstd_bound,
	                                                  buffer.InternalBuffer(), buffer.AllocSize(), compression_level);
	D_ASSERT(!duckdb_zstd::ZSTD_isError(zstd_size));
	Store<idx_t>(zstd_size, compressed_buffer.get());
	const auto compressed_size = sizeof(idx_t) + zstd_size;

	if (compressed_size > TemporaryBufferSizeToSize(MaximumCompressedTemporaryBufferSize())) {
		return {TemporaryBufferSize::DEFAULT, level}; // Use default size if compression ratio is bad
	}

	return {RoundUpSizeToTemporaryBufferSize(compressed_size), level};
}